

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

void write_to_replay_log(__cilkrts_worker *w,char *type,__cilkrts_pedigree *initial_node,int i1,
                        int i2)

{
  char pedigree [512];
  char acStack_228 [520];
  
  if (initial_node == (__cilkrts_pedigree *)0x0) {
    strcpy_s(acStack_228,0x200,"0");
  }
  else {
    walk_pedigree_nodes(acStack_228,initial_node);
  }
  fprintf((FILE *)w->l->record_replay_fptr,"%s %s %d %d\n",type,acStack_228,(ulong)(uint)i1,i2);
  fflush((FILE *)w->l->record_replay_fptr);
  return;
}

Assistant:

static
void write_to_replay_log (__cilkrts_worker *w, const char *type,
                          const __cilkrts_pedigree *initial_node,
                          int i1 = -1, int i2 = -1)
{
    char pedigree[PEDIGREE_BUFF_SIZE];

    // If we don't have an initial pedigree node, just use "0" to fill the slot
    if (NULL == initial_node)
        cilk_strcpy_s(pedigree, PEDIGREE_BUFF_SIZE, "0");
    else
        walk_pedigree_nodes(pedigree, initial_node);

#ifndef INCLUDE_SEQUENCE_NUMBER
    // Simply write the record
    fprintf(w->l->record_replay_fptr, "%s %s %d %d\n",
            type, pedigree, i1, i2);
#else
    // Write the record with a sequence number.  The sequence number should
    // always be the last term, and ignored on read

    static long volatile seq_num = 0;
    long write_num;

    // Atomic increment functions are compiler/OS-specific
#ifdef _WIN32
    write_num = _InterlockedIncrement(&seq_num);
#else /* GCC */
    write_num = __sync_add_and_fetch(&seq_num, 1);
#endif // _WIN32

    fprintf(w->l->record_replay_fptr, "%s %s %d %d %ld\n",
            type, pedigree, i1, i2, write_num);
#endif // INCLUDE_SEQUENCE_NUMBER

    fflush(w->l->record_replay_fptr);
}